

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgetwindow_p.cpp
# Opt level: O3

void QWidgetWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  char *pcVar1;
  Data *pDVar2;
  qsizetype qVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  long lVar6;
  storage_type *psVar7;
  storage_type *psVar8;
  long in_FS_OFFSET;
  QLatin1String QVar9;
  QByteArrayView QVar10;
  QArrayData *pQStack_a8;
  char16_t *pcStack_a0;
  qsizetype qStack_98;
  QStringBuilder<QString,_QLatin1String> QStack_88;
  QString QStack_58;
  QArrayData *pQStack_38;
  char16_t *pcStack_30;
  undefined1 *puStack_28;
  long lStack_18;
  
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  lStack_18 = *(long *)(in_FS_OFFSET + 0x28);
  puStack_28 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_30 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QObject::objectName();
  if (puStack_28 == (undefined1 *)0x0) {
    (**(code **)**(undefined8 **)(_o + 0x30))();
    lVar6 = QMetaObject::className();
    if (lVar6 == 0) {
      psVar8 = (storage_type *)0x0;
    }
    else {
      psVar7 = (storage_type *)0xffffffffffffffff;
      do {
        psVar8 = psVar7 + 1;
        pcVar1 = psVar7 + lVar6 + 1;
        psVar7 = psVar8;
      } while (*pcVar1 != '\0');
    }
    QVar10.m_data = psVar8;
    QVar10.m_size = (qsizetype)&pQStack_a8;
    QString::fromUtf8(QVar10);
    QStack_88.a.d.size = qStack_98;
    QStack_88.a.d.ptr = pcStack_a0;
    QStack_88.a.d.d = (Data *)pQStack_a8;
    pQStack_a8 = (QArrayData *)0x0;
    pcStack_a0 = (char16_t *)0x0;
    qStack_98 = 0;
    QStack_88.b.m_size = 5;
    QStack_88.b.m_data = "Class";
    QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&QStack_58,&QStack_88);
    pcVar5 = pcStack_30;
    pQVar4 = pQStack_38;
    qVar3 = QStack_58.d.size;
    pDVar2 = QStack_58.d.d;
    QStack_58.d.d = (Data *)pQStack_38;
    pQStack_38 = &pDVar2->super_QArrayData;
    pcStack_30 = QStack_58.d.ptr;
    QStack_58.d.ptr = pcVar5;
    QStack_58.d.size = (qsizetype)puStack_28;
    puStack_28 = (undefined1 *)qVar3;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
    if (&(QStack_88.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((QStack_88.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_88.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QStack_88.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(QStack_88.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (pQStack_a8 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_a8,2,0x10);
      }
    }
  }
  QVar9.m_data = (char *)0x6;
  QVar9.m_size = (qsizetype)&pQStack_38;
  QString::append(QVar9);
  QObject::doSetObjectName((QString *)_o);
  if (pQStack_38 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQStack_38,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidgetWindow *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->updateObjectName(); break;
        default: ;
        }
    }
    (void)_a;
}